

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn5s.hpp
# Opt level: O3

void __thiscall trng::yarn5s::split(yarn5s *this,uint s,uint n)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint i_9;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int32_t iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint i;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  int32_t iVar19;
  bool bVar20;
  int32_t a [5];
  int32_t b [25];
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uint local_d8;
  uint local_d4;
  uint local_b8;
  uint uStack_b4;
  int32_t iStack_b0;
  int32_t iStack_ac;
  int local_a8;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  int32_t local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  int32_t local_48;
  int32_t local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  
  if (s <= n) {
    std::invalid_argument::invalid_argument
              ((invalid_argument *)&local_98,"invalid argument for trng::yarn5s::split");
    utility::throw_this<std::invalid_argument>((invalid_argument *)&local_98);
    std::invalid_argument::~invalid_argument((invalid_argument *)&local_98);
  }
  if (1 < s) {
    uVar3 = (ulong)n + 1;
    if (n < 0xf) {
      uVar15 = (this->S).r[1];
      uVar16 = (this->S).r[2];
      uVar8 = (this->S).r[3];
      uVar14 = (this->S).r[4];
      local_ec = (this->S).r[0];
      do {
        uVar7 = local_ec;
        uVar6 = uVar8;
        uVar8 = uVar16;
        uVar16 = uVar15;
        uVar12 = (long)(int)uVar6 * (long)(this->P).a[3] + (long)(int)uVar8 * (long)(this->P).a[2] +
                 (long)(int)uVar16 * (long)(this->P).a[1] + (long)(int)uVar7 * (long)(this->P).a[0];
        uVar17 = uVar12 + 0x8000b0e1c2e43c3e;
        if (uVar12 < 0x7fff4f1e3d1bc3c2) {
          uVar17 = uVar12;
        }
        uVar17 = (long)(int)uVar14 * (long)(this->P).a[4] + uVar17;
        uVar17 = (uVar17 >> 0x1f) * -0x7fffa78f + uVar17;
        uVar17 = (uVar17 >> 0x1f) * -0x7fffa78f + uVar17;
        uVar15 = (uint)uVar17;
        local_ec = uVar15 + 0x80005871;
        if (uVar17 < 0x7fffa78f) {
          local_ec = uVar15;
        }
        uVar1 = (int)uVar3 - 1;
        uVar3 = (ulong)uVar1;
        uVar15 = uVar7;
        uVar14 = uVar6;
      } while (uVar1 != 0);
      (this->S).r[0] = local_ec;
      (this->S).r[1] = uVar7;
      (this->S).r[2] = uVar16;
      (this->S).r[3] = uVar8;
      (this->S).r[4] = uVar6;
    }
    else {
      uVar15 = 0;
      do {
        if ((uVar3 & 1) != 0) {
          jump2(this,uVar15);
        }
        uVar15 = uVar15 + 1;
        bVar20 = 1 < uVar3;
        uVar3 = uVar3 >> 1;
      } while (bVar20);
      local_ec = (this->S).r[0];
    }
    uVar3 = (ulong)s;
    if (s < 0x10) {
      uVar17 = uVar3;
      uVar15 = (this->S).r[1];
      uVar16 = (this->S).r[2];
      uVar8 = (this->S).r[3];
      uVar14 = (this->S).r[4];
      local_e4 = local_ec;
      do {
        uVar7 = local_e4;
        uVar6 = uVar8;
        uVar8 = uVar16;
        uVar16 = uVar15;
        uVar13 = (long)(int)uVar6 * (long)(this->P).a[3] + (long)(int)uVar8 * (long)(this->P).a[2] +
                 (long)(int)uVar16 * (long)(this->P).a[1] + (long)(int)uVar7 * (long)(this->P).a[0];
        uVar12 = uVar13 + 0x8000b0e1c2e43c3e;
        if (uVar13 < 0x7fff4f1e3d1bc3c2) {
          uVar12 = uVar13;
        }
        uVar12 = (long)(int)uVar14 * (long)(this->P).a[4] + uVar12;
        uVar12 = (uVar12 >> 0x1f) * -0x7fffa78f + uVar12;
        uVar12 = (uVar12 >> 0x1f) * -0x7fffa78f + uVar12;
        uVar15 = (uint)uVar12;
        local_e4 = uVar15 + 0x80005871;
        if (uVar12 < 0x7fffa78f) {
          local_e4 = uVar15;
        }
        uVar1 = (int)uVar17 - 1;
        uVar17 = (ulong)uVar1;
        uVar15 = uVar7;
        uVar14 = uVar6;
      } while (uVar1 != 0);
      (this->S).r[0] = local_e4;
      (this->S).r[1] = uVar7;
      (this->S).r[2] = uVar16;
      (this->S).r[3] = uVar8;
      (this->S).r[4] = uVar6;
    }
    else {
      uVar15 = 0;
      uVar17 = uVar3;
      do {
        if ((uVar17 & 1) != 0) {
          jump2(this,uVar15);
        }
        uVar15 = uVar15 + 1;
        bVar20 = 1 < uVar17;
        uVar17 = uVar17 >> 1;
      } while (bVar20);
      local_e4 = (this->S).r[0];
    }
    if (s < 0x10) {
      uVar15 = (this->S).r[1];
      uVar16 = (this->S).r[2];
      uVar8 = (this->S).r[3];
      uVar14 = (this->S).r[4];
      local_e8 = local_e4;
      uVar6 = s;
      do {
        uVar1 = local_e8;
        uVar7 = uVar8;
        uVar8 = uVar16;
        uVar16 = uVar15;
        uVar12 = (long)(int)uVar7 * (long)(this->P).a[3] + (long)(int)uVar8 * (long)(this->P).a[2] +
                 (long)(int)uVar16 * (long)(this->P).a[1] + (long)(int)uVar1 * (long)(this->P).a[0];
        uVar17 = uVar12 + 0x8000b0e1c2e43c3e;
        if (uVar12 < 0x7fff4f1e3d1bc3c2) {
          uVar17 = uVar12;
        }
        uVar17 = (long)(int)uVar14 * (long)(this->P).a[4] + uVar17;
        uVar17 = (uVar17 >> 0x1f) * -0x7fffa78f + uVar17;
        uVar17 = (uVar17 >> 0x1f) * -0x7fffa78f + uVar17;
        uVar15 = (uint)uVar17;
        local_e8 = uVar15 + 0x80005871;
        if (uVar17 < 0x7fffa78f) {
          local_e8 = uVar15;
        }
        uVar6 = uVar6 - 1;
        uVar15 = uVar1;
        uVar14 = uVar7;
      } while (uVar6 != 0);
      (this->S).r[0] = local_e8;
      (this->S).r[1] = uVar1;
      (this->S).r[2] = uVar16;
      (this->S).r[3] = uVar8;
      (this->S).r[4] = uVar7;
    }
    else {
      uVar15 = 0;
      uVar17 = uVar3;
      do {
        if ((uVar17 & 1) != 0) {
          jump2(this,uVar15);
        }
        uVar15 = uVar15 + 1;
        bVar20 = 1 < uVar17;
        uVar17 = uVar17 >> 1;
      } while (bVar20);
      local_e8 = (this->S).r[0];
    }
    if (s < 0x10) {
      uVar15 = (this->S).r[1];
      uVar16 = (this->S).r[2];
      uVar8 = (this->S).r[3];
      uVar14 = (this->S).r[4];
      local_d4 = local_e8;
      uVar6 = s;
      do {
        uVar1 = local_d4;
        uVar7 = uVar8;
        uVar8 = uVar16;
        uVar16 = uVar15;
        uVar12 = (long)(int)uVar7 * (long)(this->P).a[3] + (long)(int)uVar8 * (long)(this->P).a[2] +
                 (long)(int)uVar16 * (long)(this->P).a[1] + (long)(int)uVar1 * (long)(this->P).a[0];
        uVar17 = uVar12 + 0x8000b0e1c2e43c3e;
        if (uVar12 < 0x7fff4f1e3d1bc3c2) {
          uVar17 = uVar12;
        }
        uVar17 = (long)(int)uVar14 * (long)(this->P).a[4] + uVar17;
        uVar17 = (uVar17 >> 0x1f) * -0x7fffa78f + uVar17;
        uVar17 = (uVar17 >> 0x1f) * -0x7fffa78f + uVar17;
        uVar15 = (uint)uVar17;
        local_d4 = uVar15 + 0x80005871;
        if (uVar17 < 0x7fffa78f) {
          local_d4 = uVar15;
        }
        uVar6 = uVar6 - 1;
        uVar15 = uVar1;
        uVar14 = uVar7;
      } while (uVar6 != 0);
      (this->S).r[0] = local_d4;
      (this->S).r[1] = uVar1;
      (this->S).r[2] = uVar16;
      (this->S).r[3] = uVar8;
      (this->S).r[4] = uVar7;
    }
    else {
      uVar15 = 0;
      uVar17 = uVar3;
      do {
        if ((uVar17 & 1) != 0) {
          jump2(this,uVar15);
        }
        uVar15 = uVar15 + 1;
        bVar20 = 1 < uVar17;
        uVar17 = uVar17 >> 1;
      } while (bVar20);
      local_d4 = (this->S).r[0];
    }
    if (s < 0x10) {
      uVar15 = (this->S).r[1];
      uVar16 = (this->S).r[2];
      uVar8 = (this->S).r[3];
      uVar14 = (this->S).r[4];
      local_d8 = local_d4;
      uVar6 = s;
      do {
        uVar1 = local_d8;
        uVar7 = uVar8;
        uVar8 = uVar16;
        uVar16 = uVar15;
        uVar12 = (long)(int)uVar7 * (long)(this->P).a[3] + (long)(int)uVar8 * (long)(this->P).a[2] +
                 (long)(int)uVar16 * (long)(this->P).a[1] + (long)(int)uVar1 * (long)(this->P).a[0];
        uVar17 = uVar12 + 0x8000b0e1c2e43c3e;
        if (uVar12 < 0x7fff4f1e3d1bc3c2) {
          uVar17 = uVar12;
        }
        uVar17 = (long)(int)uVar14 * (long)(this->P).a[4] + uVar17;
        uVar17 = (uVar17 >> 0x1f) * -0x7fffa78f + uVar17;
        uVar17 = (uVar17 >> 0x1f) * -0x7fffa78f + uVar17;
        uVar15 = (uint)uVar17;
        local_d8 = uVar15 + 0x80005871;
        if (uVar17 < 0x7fffa78f) {
          local_d8 = uVar15;
        }
        uVar6 = uVar6 - 1;
        uVar15 = uVar1;
        uVar14 = uVar7;
      } while (uVar6 != 0);
      (this->S).r[0] = local_d8;
      (this->S).r[1] = uVar1;
      (this->S).r[2] = uVar16;
      (this->S).r[3] = uVar8;
      (this->S).r[4] = uVar7;
    }
    else {
      uVar15 = 0;
      uVar17 = uVar3;
      do {
        if ((uVar17 & 1) != 0) {
          jump2(this,uVar15);
        }
        uVar15 = uVar15 + 1;
        bVar20 = 1 < uVar17;
        uVar17 = uVar17 >> 1;
      } while (bVar20);
      local_d8 = (this->S).r[0];
    }
    if (s < 0x10) {
      uVar16 = (this->S).r[1];
      uVar8 = (this->S).r[2];
      uVar14 = (this->S).r[3];
      uVar6 = (this->S).r[4];
      uVar15 = local_d8;
      uVar7 = s;
      do {
        uVar1 = uVar15;
        uVar4 = uVar14;
        uVar14 = uVar8;
        uVar8 = uVar16;
        uVar12 = (long)(int)uVar4 * (long)(this->P).a[3] + (long)(int)uVar14 * (long)(this->P).a[2]
                 + (long)(int)uVar8 * (long)(this->P).a[1] + (long)(int)uVar1 * (long)(this->P).a[0]
        ;
        uVar17 = uVar12 + 0x8000b0e1c2e43c3e;
        if (uVar12 < 0x7fff4f1e3d1bc3c2) {
          uVar17 = uVar12;
        }
        uVar17 = (long)(int)uVar6 * (long)(this->P).a[4] + uVar17;
        uVar17 = (uVar17 >> 0x1f) * -0x7fffa78f + uVar17;
        uVar17 = (uVar17 >> 0x1f) * -0x7fffa78f + uVar17;
        uVar16 = (uint)uVar17;
        uVar15 = uVar16 + 0x80005871;
        if (uVar17 < 0x7fffa78f) {
          uVar15 = uVar16;
        }
        uVar7 = uVar7 - 1;
        uVar16 = uVar1;
        uVar6 = uVar4;
      } while (uVar7 != 0);
      (this->S).r[0] = uVar15;
      (this->S).r[1] = uVar1;
      (this->S).r[2] = uVar8;
      (this->S).r[3] = uVar14;
      (this->S).r[4] = uVar4;
    }
    else {
      uVar15 = 0;
      uVar17 = uVar3;
      do {
        if ((uVar17 & 1) != 0) {
          jump2(this,uVar15);
        }
        uVar15 = uVar15 + 1;
        bVar20 = 1 < uVar17;
        uVar17 = uVar17 >> 1;
      } while (bVar20);
      uVar15 = (this->S).r[0];
    }
    if (s < 0x10) {
      uVar16 = uVar15;
      uVar8 = (this->S).r[1];
      uVar14 = (this->S).r[2];
      uVar6 = (this->S).r[3];
      uVar7 = (this->S).r[4];
      uVar1 = s;
      do {
        uVar4 = uVar6;
        uVar6 = uVar14;
        uVar14 = uVar8;
        uVar8 = uVar16;
        uVar12 = (long)(int)uVar4 * (long)(this->P).a[3] + (long)(int)uVar6 * (long)(this->P).a[2] +
                 (long)(int)uVar14 * (long)(this->P).a[1] + (long)(int)uVar8 * (long)(this->P).a[0];
        uVar17 = uVar12 + 0x8000b0e1c2e43c3e;
        if (uVar12 < 0x7fff4f1e3d1bc3c2) {
          uVar17 = uVar12;
        }
        uVar17 = (long)(int)uVar7 * (long)(this->P).a[4] + uVar17;
        uVar17 = (uVar17 >> 0x1f) * -0x7fffa78f + uVar17;
        uVar17 = (uVar17 >> 0x1f) * -0x7fffa78f + uVar17;
        uVar7 = (uint)uVar17;
        uVar16 = uVar7 + 0x80005871;
        if (uVar17 < 0x7fffa78f) {
          uVar16 = uVar7;
        }
        uVar1 = uVar1 - 1;
        uVar7 = uVar4;
      } while (uVar1 != 0);
      (this->S).r[0] = uVar16;
      (this->S).r[1] = uVar8;
      (this->S).r[2] = uVar14;
      (this->S).r[3] = uVar6;
      (this->S).r[4] = uVar4;
    }
    else {
      uVar16 = 0;
      uVar17 = uVar3;
      do {
        if ((uVar17 & 1) != 0) {
          jump2(this,uVar16);
        }
        uVar16 = uVar16 + 1;
        bVar20 = 1 < uVar17;
        uVar17 = uVar17 >> 1;
      } while (bVar20);
      uVar16 = (this->S).r[0];
    }
    if (s < 0x10) {
      uVar17 = (ulong)uVar16;
      iVar2 = (this->S).r[1];
      iVar11 = (this->S).r[2];
      iVar9 = (this->S).r[3];
      iVar18 = (this->S).r[4];
      uVar8 = s;
      do {
        iVar5 = iVar9;
        iVar9 = iVar11;
        iVar11 = iVar2;
        iVar2 = (int)uVar17;
        uVar17 = (long)iVar5 * (long)(this->P).a[3] + (long)iVar9 * (long)(this->P).a[2] +
                 (long)iVar11 * (long)(this->P).a[1] + (long)iVar2 * (long)(this->P).a[0];
        uVar12 = uVar17 + 0x8000b0e1c2e43c3e;
        if (uVar17 < 0x7fff4f1e3d1bc3c2) {
          uVar12 = uVar17;
        }
        uVar12 = (long)iVar18 * (long)(this->P).a[4] + uVar12;
        uVar12 = (uVar12 >> 0x1f) * -0x7fffa78f + uVar12;
        uVar12 = (uVar12 >> 0x1f) * -0x7fffa78f + uVar12;
        uVar17 = (ulong)((int)uVar12 + 0x80005871);
        if (uVar12 < 0x7fffa78f) {
          uVar17 = uVar12 & 0xffffffff;
        }
        uVar8 = uVar8 - 1;
        iVar18 = iVar5;
      } while (uVar8 != 0);
      (this->S).r[0] = (int)uVar17;
      (this->S).r[1] = iVar2;
      (this->S).r[2] = iVar11;
      (this->S).r[3] = iVar9;
      (this->S).r[4] = iVar5;
    }
    else {
      uVar8 = 0;
      uVar17 = uVar3;
      do {
        if ((uVar17 & 1) != 0) {
          jump2(this,uVar8);
        }
        uVar8 = uVar8 + 1;
        bVar20 = 1 < uVar17;
        uVar17 = uVar17 >> 1;
      } while (bVar20);
      uVar17 = (ulong)(uint)(this->S).r[0];
    }
    iVar10 = (int32_t)uVar17;
    if (s < 0x10) {
      iVar2 = (this->S).r[1];
      iVar11 = (this->S).r[2];
      iVar9 = (this->S).r[3];
      iVar18 = (this->S).r[4];
      uVar8 = s;
      do {
        iVar5 = iVar9;
        iVar9 = iVar11;
        iVar11 = iVar2;
        iVar2 = (int)uVar17;
        uVar17 = (long)iVar5 * (long)(this->P).a[3] + (long)iVar9 * (long)(this->P).a[2] +
                 (long)iVar11 * (long)(this->P).a[1] + (long)iVar2 * (long)(this->P).a[0];
        uVar12 = uVar17 + 0x8000b0e1c2e43c3e;
        if (uVar17 < 0x7fff4f1e3d1bc3c2) {
          uVar12 = uVar17;
        }
        uVar12 = (long)iVar18 * (long)(this->P).a[4] + uVar12;
        uVar12 = (uVar12 >> 0x1f) * -0x7fffa78f + uVar12;
        uVar12 = (uVar12 >> 0x1f) * -0x7fffa78f + uVar12;
        uVar17 = (ulong)((int)uVar12 + 0x80005871);
        if (uVar12 < 0x7fffa78f) {
          uVar17 = uVar12 & 0xffffffff;
        }
        uVar8 = uVar8 - 1;
        iVar18 = iVar5;
      } while (uVar8 != 0);
      (this->S).r[0] = (int)uVar17;
      (this->S).r[1] = iVar2;
      (this->S).r[2] = iVar11;
      (this->S).r[3] = iVar9;
      (this->S).r[4] = iVar5;
    }
    else {
      uVar8 = 0;
      uVar17 = uVar3;
      do {
        if ((uVar17 & 1) != 0) {
          jump2(this,uVar8);
        }
        uVar8 = uVar8 + 1;
        bVar20 = 1 < uVar17;
        uVar17 = uVar17 >> 1;
      } while (bVar20);
      uVar17 = (ulong)(uint)(this->S).r[0];
    }
    iVar19 = (int32_t)uVar17;
    if (s < 0x10) {
      iVar2 = (this->S).r[1];
      iVar11 = (this->S).r[2];
      iVar9 = (this->S).r[3];
      iVar18 = (this->S).r[4];
      do {
        iVar5 = iVar9;
        iVar9 = iVar11;
        iVar11 = iVar2;
        iVar2 = (int)uVar17;
        uVar17 = (long)iVar5 * (long)(this->P).a[3] + (long)iVar9 * (long)(this->P).a[2] +
                 (long)iVar11 * (long)(this->P).a[1] + (long)iVar2 * (long)(this->P).a[0];
        uVar3 = uVar17 + 0x8000b0e1c2e43c3e;
        if (uVar17 < 0x7fff4f1e3d1bc3c2) {
          uVar3 = uVar17;
        }
        uVar3 = (long)iVar18 * (long)(this->P).a[4] + uVar3;
        uVar3 = (uVar3 >> 0x1f) * -0x7fffa78f + uVar3;
        uVar3 = (uVar3 >> 0x1f) * -0x7fffa78f + uVar3;
        uVar17 = (ulong)((int)uVar3 + 0x80005871);
        if (uVar3 < 0x7fffa78f) {
          uVar17 = uVar3 & 0xffffffff;
        }
        local_a8 = (int)uVar17;
        s = s - 1;
        iVar18 = iVar5;
      } while (s != 0);
      (this->S).r[0] = local_a8;
      (this->S).r[1] = iVar2;
      (this->S).r[2] = iVar11;
      (this->S).r[3] = iVar9;
      (this->S).r[4] = iVar5;
    }
    else {
      uVar8 = 0;
      do {
        if ((uVar3 & 1) != 0) {
          jump2(this,uVar8);
        }
        uVar8 = uVar8 + 1;
        bVar20 = 1 < uVar3;
        uVar3 = uVar3 >> 1;
      } while (bVar20);
      local_a8 = (this->S).r[0];
    }
    local_98 = local_d8;
    local_94 = local_d4;
    local_90 = local_e8;
    local_8c = local_e4;
    local_88 = local_ec;
    local_80 = local_d8;
    local_7c = local_d4;
    local_78 = local_e8;
    local_74 = local_e4;
    local_68 = local_d8;
    local_64 = local_d4;
    local_60 = local_e8;
    local_50 = local_d8;
    local_4c = local_d4;
    local_38 = local_d8;
    local_b8 = uVar15;
    uStack_b4 = uVar16;
    iStack_b0 = iVar10;
    iStack_ac = iVar19;
    local_84 = uVar15;
    local_70 = uVar16;
    local_6c = uVar15;
    local_5c = iVar10;
    local_58 = uVar16;
    local_54 = uVar15;
    local_48 = iVar19;
    local_44 = iVar10;
    local_40 = uVar16;
    local_3c = uVar15;
    int_math::gauss<5>((int32_t (*) [25])&local_98,(int32_t (*) [5])&local_b8,0x7fffa78f);
    *(ulong *)(this->P).a = CONCAT44(uStack_b4,local_b8);
    *(ulong *)((this->P).a + 2) = CONCAT44(iStack_ac,iStack_b0);
    (this->P).a[4] = local_a8;
    (this->S).r[0] = local_d8;
    (this->S).r[1] = local_d4;
    (this->S).r[2] = local_e8;
    (this->S).r[3] = local_e4;
    (this->S).r[4] = local_ec;
    iVar2 = 5;
    do {
      backward(this);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn5s::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(std::invalid_argument("invalid argument for trng::yarn5s::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      const int32_t q0{S.r[0]};
      jump(s);
      const int32_t q1{S.r[0]};
      jump(s);
      const int32_t q2{S.r[0]};
      jump(s);
      const int32_t q3{S.r[0]};
      jump(s);
      const int32_t q4{S.r[0]};
      jump(s);
      const int32_t q5{S.r[0]};
      jump(s);
      const int32_t q6{S.r[0]};
      jump(s);
      const int32_t q7{S.r[0]};
      jump(s);
      const int32_t q8{S.r[0]};
      jump(s);
      const int32_t q9{S.r[0]};
      int32_t a[5], b[25];
      a[0] = q5;
      b[0] = q4;
      b[1] = q3;
      b[2] = q2;
      b[3] = q1;
      b[4] = q0;
      a[1] = q6;
      b[5] = q5;
      b[6] = q4;
      b[7] = q3;
      b[8] = q2;
      b[9] = q1;
      a[2] = q7;
      b[10] = q6;
      b[11] = q5;
      b[12] = q4;
      b[13] = q3;
      b[14] = q2;
      a[3] = q8;
      b[15] = q7;
      b[16] = q6;
      b[17] = q5;
      b[18] = q4;
      b[19] = q3;
      a[4] = q9;
      b[20] = q8;
      b[21] = q7;
      b[22] = q6;
      b[23] = q5;
      b[24] = q4;
      int_math::gauss<5>(b, a, modulus);
      P.a[0] = a[0];
      P.a[1] = a[1];
      P.a[2] = a[2];
      P.a[3] = a[3];
      P.a[4] = a[4];
      S.r[0] = q4;
      S.r[1] = q3;
      S.r[2] = q2;
      S.r[3] = q1;
      S.r[4] = q0;
      for (int i{0}; i < 5; ++i)
        backward();
    }
  }